

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O2

void getnameinfo_req(uv_getnameinfo_t *handle,int status,char *hostname,char *service)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if (handle == (uv_getnameinfo_t *)0x0) {
    pcVar1 = "handle != NULL";
    uStack_10 = 0x29;
  }
  else if (status == 0) {
    if (hostname == (char *)0x0) {
      pcVar1 = "hostname != NULL";
      uStack_10 = 0x2b;
    }
    else {
      if (service != (char *)0x0) {
        return;
      }
      pcVar1 = "service != NULL";
      uStack_10 = 0x2c;
    }
  }
  else {
    pcVar1 = "status == 0";
    uStack_10 = 0x2a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void getnameinfo_req(uv_getnameinfo_t* handle,
                            int status,
                            const char* hostname,
                            const char* service) {
  ASSERT(handle != NULL);
  ASSERT(status == 0);
  ASSERT(hostname != NULL);
  ASSERT(service != NULL);
}